

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InitTermTest.cpp
# Opt level: O0

int main(int argC,char **argV)

{
  char *xmlFile_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  uint local_30;
  uint i;
  bool error;
  char *xmlFile;
  int parmInd;
  bool gSchemaFullChecking;
  bool gDoSchema;
  bool gDoNamespaces;
  char **argV_local;
  int argC_local;
  
  xmlFile._7_1_ = false;
  xmlFile._6_1_ = false;
  xmlFile._5_1_ = false;
  if (argC < 2) {
    usage();
    return 1;
  }
  xmlFile._0_4_ = 1;
  while (((int)xmlFile < argC && (*argV[(int)xmlFile] == '-'))) {
    iVar2 = strcmp(argV[(int)xmlFile],"-?");
    if (iVar2 == 0) {
      usage();
      return 2;
    }
    iVar2 = strcmp(argV[(int)xmlFile],"-n");
    if ((iVar2 == 0) || (iVar2 = strcmp(argV[(int)xmlFile],"-N"), iVar2 == 0)) {
      xmlFile._7_1_ = true;
    }
    else {
      iVar2 = strcmp(argV[(int)xmlFile],"-s");
      if ((iVar2 == 0) || (iVar2 = strcmp(argV[(int)xmlFile],"-S"), iVar2 == 0)) {
        xmlFile._6_1_ = true;
      }
      else {
        iVar2 = strcmp(argV[(int)xmlFile],"-f");
        if ((iVar2 == 0) || (iVar2 = strcmp(argV[(int)xmlFile],"-F"), iVar2 == 0)) {
          xmlFile._5_1_ = true;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
          poVar3 = std::operator<<(poVar3,argV[(int)xmlFile]);
          poVar3 = std::operator<<(poVar3,"\', ignoring it.\n");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    xmlFile._0_4_ = (int)xmlFile + 1;
  }
  if ((int)xmlFile + 1 != argC) {
    usage();
    return 1;
  }
  xmlFile_00 = argV[(int)xmlFile];
  bVar1 = false;
  for (local_30 = 0; local_30 < 100; local_30 = local_30 + 1) {
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Test Failed");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return 4;
    }
    iVar2 = TestInit4DOM(xmlFile_00,xmlFile._7_1_,xmlFile._6_1_,xmlFile._5_1_,Once);
    if (iVar2 != 0) {
      bVar1 = true;
    }
    iVar2 = TestInit4SAX(xmlFile_00,xmlFile._7_1_,xmlFile._6_1_,xmlFile._5_1_,Once);
    if (iVar2 != 0) {
      bVar1 = true;
    }
    iVar2 = TestInit4SAX2(xmlFile_00,xmlFile._7_1_,xmlFile._6_1_,xmlFile._5_1_,Once);
    if (iVar2 != 0) {
      bVar1 = true;
    }
  }
  if (bVar1) {
LAB_00105ff1:
    bVar1 = true;
  }
  else {
    iVar2 = TestInit4DOM(xmlFile_00,xmlFile._7_1_,xmlFile._6_1_,xmlFile._5_1_,Multiple);
    bVar1 = false;
    if (iVar2 != 0) goto LAB_00105ff1;
  }
  if (bVar1) {
LAB_00106029:
    bVar1 = true;
  }
  else {
    iVar2 = TestInit4SAX(xmlFile_00,xmlFile._7_1_,xmlFile._6_1_,xmlFile._5_1_,Multiple);
    bVar1 = false;
    if (iVar2 != 0) goto LAB_00106029;
  }
  if (bVar1) {
LAB_00106061:
    bVar1 = true;
  }
  else {
    iVar2 = TestInit4SAX2(xmlFile_00,xmlFile._7_1_,xmlFile._6_1_,xmlFile._5_1_,Multiple);
    bVar1 = false;
    if (iVar2 != 0) goto LAB_00106061;
  }
  if (bVar1) {
LAB_00106099:
    bVar1 = true;
  }
  else {
    iVar2 = TestInit4DOM(xmlFile_00,xmlFile._7_1_,xmlFile._6_1_,xmlFile._5_1_,UnEven);
    bVar1 = false;
    if (iVar2 != 0) goto LAB_00106099;
  }
  if (bVar1) {
LAB_001060d1:
    bVar1 = true;
  }
  else {
    iVar2 = TestInit4SAX(xmlFile_00,xmlFile._7_1_,xmlFile._6_1_,xmlFile._5_1_,UnEven);
    bVar1 = false;
    if (iVar2 != 0) goto LAB_001060d1;
  }
  if (!bVar1) {
    iVar2 = TestInit4SAX2(xmlFile_00,xmlFile._7_1_,xmlFile._6_1_,xmlFile._5_1_,UnEven);
    bVar1 = false;
    if (iVar2 == 0) goto LAB_0010610d;
  }
  bVar1 = true;
LAB_0010610d:
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Test Failed");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argV_local._4_4_ = 4;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Test Run Successfully");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    argV_local._4_4_ = 0;
  }
  return argV_local._4_4_;
}

Assistant:

int main(int argC, char* argV[]) {

    // ---------------------------------------------------------------------------
    //  Local data
    //
    //  gDoNamespaces
    //      Indicates whether namespace processing should be done.
    //
    //  gDoSchema
    //      Indicates whether schema processing should be done.
    //
    //  gSchemaFullChecking
    //      Indicates whether full schema constraint checking should be done.
    //
    // ---------------------------------------------------------------------------
    bool gDoNamespaces          = false;
    bool gDoSchema              = false;
    bool gSchemaFullChecking    = false;

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    // See if non validating dom parser configuration is requested.
    int parmInd;
    for (parmInd = 1; parmInd < argC; parmInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[parmInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[parmInd], "-?"))
        {
            usage();
            return 2;
        }
         else if (!strcmp(argV[parmInd], "-n")
              ||  !strcmp(argV[parmInd], "-N"))
        {
            gDoNamespaces = true;
        }
         else if (!strcmp(argV[parmInd], "-s")
              ||  !strcmp(argV[parmInd], "-S"))
        {
            gDoSchema = true;
        }
         else if (!strcmp(argV[parmInd], "-f")
              ||  !strcmp(argV[parmInd], "-F"))
        {
            gSchemaFullChecking = true;
        }
         else
        {
            std::cerr << "Unknown option '" << argV[parmInd]
                 << "', ignoring it.\n" << std::endl;
        }
    }

    //
    //  And now we have to have only one parameter left and it must be
    //  the file name.
    //
    if (parmInd + 1 != argC)
    {
        usage();
        return 1;
    }

    char* xmlFile = argV[parmInd];
    bool error = false;

    //
    // Calling Init/Term pair a number of times
    //
    unsigned int i = 0;
    for (i=0; i < 100; i++) {
        if (error) {
            std::cout << "Test Failed" << std::endl;
            return 4;
        }

        if (TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Once))
            error = true;
        if (TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Once))
            error = true;
        if (TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Once))
            error = true;
    }

    if (error || TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Multiple))
        error = true;
    if (error || TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Multiple))
        error = true;
    if (error || TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Multiple))
        error = true;
/*
 * The following Limit test is a stress test that can run a long time
 * Commented out for regular sanity test
 */
/*
    if (error || TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Limit))
        error = true;
    if (error || TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Limit))
        error = true;
    if (error || TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, Limit))
        error = true;

    if (error || TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, ExceedLimit))
        error = true;
    if (error || TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, ExceedLimit))
        error = true;
    if (error || TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, ExceedLimit))
        error = true;
*/

    if (error || TestInit4DOM(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, UnEven))
        error = true;
    if (error || TestInit4SAX(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, UnEven))
        error = true;
    if (error || TestInit4SAX2(xmlFile, gDoNamespaces, gDoSchema, gSchemaFullChecking, UnEven))
        error = true;

    if (error) {
        std::cout << "Test Failed" << std::endl;
        return 4;
    }

    std::cout << "Test Run Successfully" << std::endl;
    return 0;
}